

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O2

void __thiscall
mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
          (section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *this,
          string *name)

{
  MPI_Comm *c;
  string *psVar1;
  long lVar2;
  ostream *poVar3;
  rep_conflict rVar4;
  double dVar5;
  time_rep elapsed;
  int p;
  int rank;
  double local_68;
  comm local_60;
  double local_40;
  double local_38;
  int local_2c;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_68 = (double)(lVar2 - (this->start).__d.__r) / 1000000.0;
  c = &this->comm;
  mxx::comm::comm(&local_60,c);
  local_38 = allreduce<double,mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::end_section(std::__cxx11::string_const&)::_lambda(double,double)_1_>
                       (&local_68,&local_60);
  mxx::comm::~comm(&local_60);
  mxx::comm::comm(&local_60,c);
  local_40 = allreduce<double,mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::end_section(std::__cxx11::string_const&)::_lambda(double,double)_2_>
                       (&local_68,&local_60);
  mxx::comm::~comm(&local_60);
  mxx::comm::comm(&local_60,c);
  dVar5 = allreduce<double,std::plus<double>>(&local_68,&local_60);
  mxx::comm::~comm(&local_60);
  MPI_Comm_rank(this->comm,&local_2c);
  MPI_Comm_size(this->comm,&local_60);
  if (local_2c == this->root) {
    poVar3 = this->ostr;
    lVar2 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 8) = 3;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    poVar3 = std::operator<<(poVar3,"TIMER");
    psVar1 = &this->sep;
    std::operator<<(poVar3,(string *)psVar1);
    poVar3 = std::ostream::_M_insert<double>(local_38);
    std::operator<<(poVar3,(string *)psVar1);
    poVar3 = std::ostream::_M_insert<double>(dVar5 / (double)(int)local_60._vptr_comm);
    std::operator<<(poVar3,(string *)psVar1);
    poVar3 = std::ostream::_M_insert<double>(local_40);
    poVar3 = std::operator<<(poVar3,(string *)psVar1);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>
                               ::depth);
    poVar3 = std::operator<<(poVar3,(string *)psVar1);
    poVar3 = std::operator<<(poVar3,(string *)name);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  MPI_Barrier(this->comm);
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->start).__d.__r = rVar4;
  return;
}

Assistant:

void end_section(const std::string& name) {
        std::chrono::steady_clock::time_point stop = std::chrono::steady_clock::now();
        time_rep elapsed = duration(stop-start).count();
        // TODO: reduce rather than allreduce
        // TODO: use single reduction with custom operator
        time_rep min = mxx::allreduce(elapsed, [](time_rep x, time_rep y){return std::min(x,y);}, comm);
        time_rep max = mxx::allreduce(elapsed, [](time_rep x, time_rep y){return std::max(x,y);}, comm);
        time_rep sum = mxx::allreduce(elapsed, std::plus<time_rep>(), comm);
        // calc mean:
        int p, rank;
        MPI_Comm_rank(comm, &rank);
        MPI_Comm_size(comm, &p);
        time_rep mean = sum / (double)p;
        // only root process outputs the timings
        if (rank == root)
            ostr << std::setprecision(3) << std::scientific << "TIMER" << sep << min << sep << mean << sep << max << sep << depth << sep << name << std::endl;
        // restart timer
        MPI_Barrier(comm);
        start = std::chrono::steady_clock::now();
    }